

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void TestCalloc(size_t n,size_t s,bool ok)

{
  void *__ptr;
  int i;
  long lVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  code *local_30;
  
  local_30 = calloc;
  (*noopt_helper)(&local_30);
  __ptr = (void *)(*local_30)(n,s);
  if ((int)CONCAT71(in_register_00000011,ok) == 0) {
    if (__ptr == (void *)0x0) {
      return;
    }
    pcVar2 = "Check failed: p == nullptr\n";
  }
  else if (__ptr == (void *)0x0) {
    pcVar2 = "Check failed: p != nullptr\n";
  }
  else {
    lVar1 = 0;
    do {
      if (s * n - lVar1 == 0) {
        free(__ptr);
        return;
      }
      pcVar2 = (char *)((long)__ptr + lVar1);
      lVar1 = lVar1 + 1;
    } while (*pcVar2 == '\0');
    pcVar2 = "Check failed: p[i] == \'\\0\'\n";
  }
  syscall(1,2,pcVar2,0x1b);
  abort();
}

Assistant:

static void TestCalloc(size_t n, size_t s, bool ok) {
  char* p = reinterpret_cast<char*>(noopt(calloc)(n, s));
  if (!ok) {
    CHECK(p == nullptr);  // calloc(n, s) should not succeed
  } else {
    CHECK(p != nullptr);  // calloc(n, s) should succeed
    for (int i = 0; i < n*s; i++) {
      CHECK(p[i] == '\0');
    }
    free(p);
  }
}